

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix-test.cc
# Opt level: O2

void __thiscall SuffixTest_Cast_Test::TestBody(SuffixTest_Cast_Test *this)

{
  SuffixBase SVar1;
  char *pcVar2;
  StringRef name;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  AssertionResult gtest_ar;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  IntSuffix is;
  
  gtest_ar._0_8_ = &local_30;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_30._M_local_buf[0] = '\0';
  name.size_ = 1;
  name.data_ = "a";
  SVar1.impl_ = (Impl *)mp::BasicSuffixSet<std::allocator<char>_>::Add<int>
                                  (&(this->super_SuffixTest).suffixes_,name,0,1,
                                   (SuffixTable *)&gtest_ar);
  is.super_SuffixBase.impl_ = (SuffixBase)(SuffixBase)SVar1.impl_;
  std::__cxx11::string::~string((string *)&gtest_ar);
  local_50.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(Impl *)0x0;
  if (((SVar1.impl_)->kind & 4) == 0) {
    local_50.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)SVar1.impl_;
  }
  testing::internal::CmpHelperEQ<mp::BasicSuffix<int>,mp::BasicSuffix<int>>
            ((internal *)&gtest_ar,"is","mp::Cast<mp::IntSuffix>(s)",&is,
             (BasicSuffix<int> *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/suffix-test.cc",
               0xe9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_50.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_48.data_ = (AssertHelperData *)SVar1.impl_;
  if (((SVar1.impl_)->kind & 4) == 0) {
    local_48.data_ = (AssertHelperData *)(Impl *)0x0;
  }
  testing::internal::CmpHelperEQ<mp::Suffix,mp::BasicSuffix<double>>
            ((internal *)&gtest_ar,"Suffix()","mp::Cast<mp::DoubleSuffix>(s)",(Suffix *)&local_50,
             (BasicSuffix<double> *)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/suffix-test.cc",
               0xea,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(SuffixTest, Cast) {
  mp::IntSuffix is = suffixes_.Add<int>("a", 0, 1);
  Suffix s = is;
  EXPECT_EQ(is, mp::Cast<mp::IntSuffix>(s));
  EXPECT_EQ(Suffix(), mp::Cast<mp::DoubleSuffix>(s));
}